

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1517.c
# Opt level: O0

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  undefined8 local_40;
  size_t tocopy;
  WriteThis *pooh;
  void *userp_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  local_40 = (void *)(size * nmemb);
  wait_ms(1000);
  if ((local_40 == (void *)0x0) || (*(long *)((long)userp + 8) == 0)) {
    ptr_local = (void *)0x0;
  }
  else {
    if (*(void **)((long)userp + 8) < local_40) {
      local_40 = *(void **)((long)userp + 8);
    }
    memcpy(ptr,*userp,(size_t)local_40);
    *(long *)userp = (long)local_40 + *userp;
    *(long *)((long)userp + 8) = *(long *)((long)userp + 8) - (long)local_40;
    ptr_local = local_40;
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct WriteThis *pooh = (struct WriteThis *)userp;
  size_t tocopy = size * nmemb;

  /* Wait one second before return POST data          *
   * so libcurl will wait before sending request body */
  wait_ms(1000);

  if(tocopy < 1 || !pooh->sizeleft)
    return 0;

  if(pooh->sizeleft < tocopy)
    tocopy = pooh->sizeleft;

  memcpy(ptr, pooh->readptr, tocopy);/* copy requested data */
  pooh->readptr += tocopy;           /* advance pointer */
  pooh->sizeleft -= tocopy;          /* less data left */
  return tocopy;
}